

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_security.c
# Opt level: O1

int overflow2(int a,int b)

{
  char *format;
  
  if (b < 1 || a < 1) {
    format = 
    "one parameter to a memory allocation multiplication is negative or zero, failing operation gracefully\n"
    ;
  }
  else {
    if (a <= (int)(0x7fffffffU / (uint)b)) {
      return 0;
    }
    format = 
    "product of memory allocation multiplication would exceed INT_MAX, failing operation gracefully\n"
    ;
  }
  gd_error_ex(4,format);
  return 1;
}

Assistant:

int overflow2(int a, int b)
{
	if(a <= 0 || b <= 0) {
		gd_error_ex(GD_WARNING, "one parameter to a memory allocation multiplication is negative or zero, failing operation gracefully\n");
		return 1;
	}
	if(a > INT_MAX / b) {
		gd_error_ex(GD_WARNING, "product of memory allocation multiplication would exceed INT_MAX, failing operation gracefully\n");
		return 1;
	}
	return 0;
}